

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Synthesizer.cpp
# Opt level: O3

void __thiscall MIDI::MidiInput::MidiInput(MidiInput *this)

{
  return;
}

Assistant:

MidiInput::MidiInput()
    {
    #if PLATFORM_WIN
        int numdevs = midiInGetNumDevs();
        for (int n = 0; n < numdevs; n++)
        {
            midiInOpen(&m_midihandle, n, (DWORD_PTR)&MidiInCallbackProc, n, CALLBACK_FUNCTION);
            midiInStart(m_midihandle);
        }
    #elif PLATFORM_OSX
        client = NULL;
        MIDIClientCreate(CFSTR("MIDI Echo"), NULL, NULL, &client);
        inPort = NULL;
        MIDIInputPortCreate(client, CFSTR("Input port"), MidiInCallbackProc, this, &inPort);
        int n = MIDIGetNumberOfSources();
        for (int i = 0; i < n; ++i)
        {
            MIDIEndpointRef src = MIDIGetSource(i);
            MIDIPortConnectSource(inPort, src, NULL);
        }
    #endif
    }